

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall
llvm::SmallPtrSetImplBase::SmallPtrSetImplBase
          (SmallPtrSetImplBase *this,void **SmallStorage,SmallPtrSetImplBase *that)

{
  bool bVar1;
  void **ppvVar2;
  SmallPtrSetImplBase *that_local;
  void **SmallStorage_local;
  SmallPtrSetImplBase *this_local;
  
  this->SmallArray = SmallStorage;
  bVar1 = isSmall(that);
  if (bVar1) {
    this->CurArray = this->SmallArray;
  }
  else {
    ppvVar2 = (void **)safe_malloc((ulong)that->CurArraySize << 3);
    this->CurArray = ppvVar2;
  }
  CopyHelper(this,that);
  return;
}

Assistant:

SmallPtrSetImplBase::SmallPtrSetImplBase(const void **SmallStorage,
                                         const SmallPtrSetImplBase &that) {
  SmallArray = SmallStorage;

  // If we're becoming small, prepare to insert into our stack space
  if (that.isSmall()) {
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else {
    CurArray = (const void**)safe_malloc(sizeof(void*) * that.CurArraySize);
  }

  // Copy over the that array.
  CopyHelper(that);
}